

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O2

FVoxelDef * R_LoadVoxelDef(int lumpnum,int spin)

{
  FVoxel *pFVar1;
  char *pcVar2;
  FVoxelDef *pFVar3;
  FVoxel *vox;
  FVoxelDef *voxdef;
  
  pFVar1 = R_LoadKVX(lumpnum);
  vox = pFVar1;
  if (pFVar1 == (FVoxel *)0x0) {
    pcVar2 = FWadCollection::GetLumpFullName(&Wads,lumpnum);
    pFVar3 = (FVoxelDef *)0x0;
    Printf("%s is not a valid voxel file\n",pcVar2);
  }
  else {
    voxdef = (FVoxelDef *)operator_new(0x28);
    voxdef->Voxel = pFVar1;
    voxdef->PlacedSpin = spin;
    voxdef->DroppedSpin = spin;
    voxdef->Scale = 1.0;
    (voxdef->AngleOffset).Degrees = 90.0;
    TArray<FVoxel_*,_FVoxel_*>::Push(&Voxels.super_TArray<FVoxel_*,_FVoxel_*>,&vox);
    TArray<FVoxelDef_*,_FVoxelDef_*>::Push
              (&VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>,&voxdef);
    pFVar3 = voxdef;
  }
  return pFVar3;
}

Assistant:

FVoxelDef *R_LoadVoxelDef(int lumpnum, int spin)
{
	FVoxel *vox = R_LoadKVX(lumpnum);
	if (vox == NULL)
	{
		Printf("%s is not a valid voxel file\n", Wads.GetLumpFullName(lumpnum));
		return NULL;
	}
	else
	{
		FVoxelDef *voxdef = new FVoxelDef;
		voxdef->Voxel = vox;
		voxdef->Scale = 1.;
		voxdef->DroppedSpin = voxdef->PlacedSpin = spin;
		voxdef->AngleOffset = 90.;

		Voxels.Push(vox);
		VoxelDefs.Push(voxdef);
		return voxdef;
	}
}